

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::im2col_sgemm_pack8to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int *piVar16;
  uint uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  void *pvVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  undefined8 *puVar26;
  long lVar27;
  undefined1 (*pauVar28) [32];
  long lVar29;
  int iVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  undefined8 *puVar33;
  undefined1 (*pauVar34) [32];
  long lVar35;
  int iVar36;
  int nn;
  int iVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  Mat local_108;
  ulong local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  uVar2 = bottom_im2col->w;
  uVar23 = (ulong)(int)uVar2;
  iVar37 = bottom_im2col->h;
  uVar21 = bottom_im2col->c;
  uVar19 = (ulong)uVar21;
  local_c0 = (ulong)(uint)top_blob->c;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  if ((long)uVar23 < 4) {
    uVar17 = uVar2;
    iVar36 = iVar37;
    if (1 < (int)uVar2) {
      iVar36 = iVar37 * 2;
      uVar17 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar17 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    iVar36 = iVar37 * 4;
  }
  Mat::create(&local_108,iVar36,uVar21,uVar17,8,8,opt->workspace_allocator);
  uVar17 = (int)uVar2 >> 2;
  if (0 < (int)uVar17) {
    lVar24 = 0;
    uVar25 = 0;
    do {
      if (0 < (int)uVar21) {
        pauVar28 = (undefined1 (*) [32])
                   (local_108.cstep * uVar25 * local_108.elemsize + (long)local_108.data);
        uVar31 = 0;
        do {
          if (0 < iVar37) {
            pauVar34 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar31 + lVar24);
            iVar36 = iVar37;
            do {
              *pauVar28 = *pauVar34;
              pauVar28 = pauVar28 + 1;
              pauVar34 = (undefined1 (*) [32])(*pauVar34 + uVar23 * 8);
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar19);
      }
      uVar25 = uVar25 + 1;
      lVar24 = lVar24 + 0x20;
    } while (uVar25 != uVar17);
  }
  uVar20 = uVar2 >> 1 & 1;
  if ((uVar20 != 0) && (0 < (int)uVar21)) {
    pauVar18 = (undefined1 (*) [16])
               ((long)(int)uVar17 * local_108.cstep * local_108.elemsize + (long)local_108.data);
    uVar25 = 0;
    do {
      if (0 < iVar37) {
        pauVar32 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 +
                   (uVar23 & 0xfffffffffffffffc) * 8);
        iVar36 = iVar37;
        do {
          *pauVar18 = *pauVar32;
          pauVar18 = pauVar18 + 1;
          pauVar32 = (undefined1 (*) [16])(*pauVar32 + uVar23 * 8);
          iVar36 = iVar36 + -1;
        } while (iVar36 != 0);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar19);
  }
  iVar36 = (int)(uVar23 & 0xfffffffffffffffc) + uVar20 * 2;
  if (iVar36 < (int)uVar2) {
    uVar25 = (ulong)iVar36;
    pvVar22 = (void *)(uVar25 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar21) {
        uVar20 = (uint)uVar25;
        uVar17 = uVar20 + 3;
        if (-1 < (int)uVar20) {
          uVar17 = uVar20;
        }
        puVar26 = (undefined8 *)
                  ((long)(int)((int)(uVar20 - (uVar17 & 0xfffffffc)) / 2 +
                              ((int)uVar17 >> 2) +
                              (uVar20 - (((uint)(uVar25 >> 0x1f) & 1) + uVar20 & 0xfffffffe))) *
                   local_108.cstep * local_108.elemsize + (long)local_108.data);
        uVar31 = 0;
        do {
          if (0 < iVar37) {
            puVar33 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar31 + (long)pvVar22);
            iVar36 = iVar37;
            do {
              *puVar26 = *puVar33;
              puVar26 = puVar26 + 1;
              puVar33 = puVar33 + uVar23;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar19);
      }
      uVar25 = uVar25 + 1;
      pvVar22 = (void *)((long)pvVar22 + 8);
    } while (uVar25 != uVar23);
  }
  if (0 < (int)local_c0) {
    iVar37 = uVar21 * iVar37;
    uVar19 = 0;
    auVar39 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
    auVar48 = ZEXT3264(auVar39);
    auVar39 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
    auVar49 = ZEXT3264(auVar39);
    auVar39 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
    auVar50 = ZEXT3264(auVar39);
    do {
      pauVar28 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar19 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar2 < 4) {
        uVar25 = 0;
      }
      else {
        lVar24 = 0;
        uVar31 = 0;
        do {
          if (iVar37 < 1) {
            local_98._0_16_ = ZEXT816(0);
            local_98 = ZEXT1632(local_98._0_16_);
            auVar43 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            local_b8._0_16_ = ZEXT816(0);
            local_b8 = ZEXT1632(local_b8._0_16_);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar27 = local_108.cstep * local_108.elemsize * lVar24;
            lVar29 = kernel->cstep * uVar19 * kernel->elemsize;
            auVar46 = ZEXT1664((undefined1  [16])0x0);
            lVar35 = 0;
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            local_b8._0_16_ = ZEXT816(0);
            local_b8 = ZEXT1632(local_b8._0_16_);
            auVar48 = ZEXT1664((undefined1  [16])0x0);
            auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            local_98._0_16_ = ZEXT816(0);
            local_98 = ZEXT1632(local_98._0_16_);
            iVar36 = iVar37;
            do {
              local_78 = auVar50._0_32_;
              local_58 = auVar49._0_32_;
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)local_108.data + lVar35 + lVar27));
              auVar41 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar35 + lVar29))
              ;
              auVar11 = vpmullw_avx2(auVar41,auVar44);
              auVar7 = vpmulhw_avx2(auVar44,auVar41);
              auVar38 = vpermq_avx2(auVar44,0x4e);
              auVar12 = vpmullw_avx2(auVar41,auVar38);
              auVar8 = vpmulhw_avx2(auVar41,auVar38);
              auVar39 = vpunpcklwd_avx2(auVar11,auVar7);
              auVar39 = vpaddd_avx2(auVar46._0_32_,auVar39);
              auVar40 = vpunpcklwd_avx2(auVar12,auVar8);
              auVar40 = vpaddd_avx2(auVar47._0_32_,auVar40);
              auVar43 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar35 + lVar29 + 0x10));
              auVar13 = vpmullw_avx2(auVar44,auVar43);
              auVar9 = vpmulhw_avx2(auVar44,auVar43);
              auVar44 = vpunpcklwd_avx2(auVar13,auVar9);
              auVar44 = vpaddd_avx2(auVar45._0_32_,auVar44);
              auVar14 = vpmullw_avx2(auVar38,auVar43);
              auVar10 = vpmulhw_avx2(auVar38,auVar43);
              auVar38 = vpunpcklwd_avx2(auVar14,auVar10);
              auVar38 = vpaddd_avx2(auVar38,local_b8);
              auVar7 = vpunpckhwd_avx2(auVar11,auVar7);
              auVar39 = vpaddd_avx2(auVar7,auVar39);
              auVar46 = ZEXT3264(auVar39);
              auVar7 = vpunpckhwd_avx2(auVar12,auVar8);
              auVar40 = vpaddd_avx2(auVar40,auVar7);
              auVar47 = ZEXT3264(auVar40);
              auVar7 = vpunpckhwd_avx2(auVar13,auVar9);
              auVar44 = vpaddd_avx2(auVar44,auVar7);
              auVar45 = ZEXT3264(auVar44);
              auVar8 = vpunpckhwd_avx2(auVar14,auVar10);
              auVar7 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                       ((long)local_108.data + lVar35 + lVar27 + 0x10));
              local_b8 = vpaddd_avx2(auVar38,auVar8);
              auVar12 = vpmullw_avx2(auVar41,auVar7);
              auVar8 = vpmulhw_avx2(auVar41,auVar7);
              auVar38 = vpermq_avx2(auVar7,0x4e);
              auVar13 = vpmullw_avx2(auVar41,auVar38);
              auVar9 = vpmulhw_avx2(auVar41,auVar38);
              auVar14 = vpmullw_avx2(auVar7,auVar43);
              auVar10 = vpmulhw_avx2(auVar7,auVar43);
              auVar15 = vpmullw_avx2(auVar38,auVar43);
              auVar11 = vpmulhw_avx2(auVar38,auVar43);
              auVar38 = vpunpcklwd_avx2(auVar12,auVar8);
              auVar38 = vpaddd_avx2(auVar48._0_32_,auVar38);
              auVar41 = vpunpcklwd_avx2(auVar13,auVar9);
              auVar41 = vpaddd_avx2(auVar41,local_58);
              auVar43 = vpunpcklwd_avx2(auVar14,auVar10);
              auVar43 = vpaddd_avx2(auVar43,local_78);
              auVar7 = vpunpcklwd_avx2(auVar15,auVar11);
              auVar7 = vpaddd_avx2(auVar7,local_98);
              auVar8 = vpunpckhwd_avx2(auVar12,auVar8);
              auVar38 = vpaddd_avx2(auVar38,auVar8);
              auVar48 = ZEXT3264(auVar38);
              auVar8 = vpunpckhwd_avx2(auVar13,auVar9);
              auVar41 = vpaddd_avx2(auVar41,auVar8);
              auVar49 = ZEXT3264(auVar41);
              auVar8 = vpunpckhwd_avx2(auVar14,auVar10);
              auVar43 = vpaddd_avx2(auVar43,auVar8);
              auVar50 = ZEXT3264(auVar43);
              auVar8 = vpunpckhwd_avx2(auVar15,auVar11);
              local_98 = vpaddd_avx2(auVar7,auVar8);
              lVar35 = lVar35 + 0x20;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          auVar10 = vpunpckldq_avx2(auVar39,auVar40);
          auVar11 = vpunpckldq_avx2(auVar44,local_b8);
          auVar40 = vpunpckhdq_avx2(auVar39,auVar40);
          auVar7 = vpunpckhdq_avx2(auVar44,local_b8);
          auVar12 = vpunpckldq_avx2(auVar38,auVar41);
          auVar13 = vpunpckldq_avx2(auVar43,local_98);
          auVar8 = vpunpckhdq_avx2(auVar38,auVar41);
          auVar9 = vpunpckhdq_avx2(auVar43,local_98);
          auVar44 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
          auVar48 = ZEXT3264(auVar44);
          auVar39 = vpermd_avx2(auVar44,auVar11);
          auVar38 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
          auVar49 = ZEXT3264(auVar38);
          auVar41 = vpermd_avx2(auVar38,auVar10);
          auVar39 = vpblendd_avx2(auVar41,auVar39,0xcc);
          auVar41 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
          auVar50 = ZEXT3264(auVar41);
          auVar11 = vpermd_avx2(auVar41,auVar11);
          auVar43 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
          auVar10 = vpermd_avx2(auVar43,auVar10);
          auVar10 = vpblendd_avx2(auVar10,auVar11,0xcc);
          auVar39 = vpaddd_avx2(auVar39,auVar10);
          auVar10 = vpermd_avx2(auVar44,auVar7);
          auVar11 = vpermd_avx2(auVar38,auVar40);
          auVar10 = vpblendd_avx2(auVar11,auVar10,0xcc);
          auVar7 = vpermd_avx2(auVar41,auVar7);
          auVar40 = vpermd_avx2(auVar43,auVar40);
          auVar40 = vpblendd_avx2(auVar40,auVar7,0xcc);
          auVar40 = vpaddd_avx2(auVar10,auVar40);
          auVar39 = vpaddd_avx2(auVar39,auVar40);
          auVar40 = vpermd_avx2(auVar44,auVar13);
          auVar7 = vpermd_avx2(auVar38,auVar12);
          auVar40 = vpblendd_avx2(auVar7,auVar40,0xcc);
          auVar7 = vpermd_avx2(auVar41,auVar13);
          auVar10 = vpermd_avx2(auVar43,auVar12);
          auVar7 = vpblendd_avx2(auVar10,auVar7,0xcc);
          auVar40 = vpaddd_avx2(auVar7,auVar40);
          auVar44 = vpermd_avx2(auVar44,auVar9);
          auVar38 = vpermd_avx2(auVar38,auVar8);
          auVar44 = vpblendd_avx2(auVar38,auVar44,0xcc);
          auVar38 = vpermd_avx2(auVar41,auVar9);
          auVar41 = vpermd_avx2(auVar43,auVar8);
          auVar38 = vpblendd_avx2(auVar41,auVar38,0xcc);
          auVar44 = vpaddd_avx2(auVar44,auVar38);
          auVar40 = vpaddd_avx2(auVar40,auVar44);
          *pauVar28 = auVar39;
          pauVar28[1] = auVar40;
          pauVar28 = pauVar28 + 2;
          uVar25 = uVar31 + 4;
          lVar27 = uVar31 + 7;
          lVar24 = lVar24 + 1;
          uVar31 = uVar25;
        } while (lVar27 < (long)uVar23);
      }
      if ((int)((uint)uVar25 | 1) < (int)uVar2) {
        uVar21 = 0;
        do {
          iVar36 = (int)uVar25;
          if (iVar37 < 1) {
            auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar44 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            lVar24 = kernel->cstep * uVar19 * kernel->elemsize;
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            lVar27 = 0;
            auVar42 = ZEXT1664((undefined1  [16])0x0);
            auVar47 = ZEXT1664((undefined1  [16])0x0);
            auVar46 = ZEXT1664((undefined1  [16])0x0);
            iVar30 = iVar37;
            do {
              auVar39 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)local_108.data +
                                        lVar27 + local_108.cstep * local_108.elemsize *
                                                 (ulong)((uVar21 & 1) +
                                                        ((uint)(uVar25 >> 2) & 0x3fffffff))));
              auVar40 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar27 * 2 + lVar24));
              auVar44 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                        ((long)kernel->data + lVar27 * 2 + lVar24 + 0x10));
              auVar9 = vpmullw_avx2(auVar40,auVar39);
              auVar41 = vpmulhw_avx2(auVar39,auVar40);
              auVar38 = vpermq_avx2(auVar39,0x4e);
              auVar10 = vpmullw_avx2(auVar38,auVar40);
              auVar43 = vpmulhw_avx2(auVar38,auVar40);
              auVar11 = vpmullw_avx2(auVar44,auVar39);
              auVar7 = vpmulhw_avx2(auVar39,auVar44);
              auVar12 = vpmullw_avx2(auVar38,auVar44);
              auVar8 = vpmulhw_avx2(auVar38,auVar44);
              auVar39 = vpunpcklwd_avx2(auVar9,auVar41);
              auVar39 = vpaddd_avx2(auVar39,auVar45._0_32_);
              auVar40 = vpunpcklwd_avx2(auVar10,auVar43);
              auVar40 = vpaddd_avx2(auVar40,auVar42._0_32_);
              auVar44 = vpunpcklwd_avx2(auVar11,auVar7);
              auVar44 = vpaddd_avx2(auVar44,auVar47._0_32_);
              auVar38 = vpunpcklwd_avx2(auVar12,auVar8);
              auVar38 = vpaddd_avx2(auVar38,auVar46._0_32_);
              auVar41 = vpunpckhwd_avx2(auVar9,auVar41);
              auVar39 = vpaddd_avx2(auVar39,auVar41);
              auVar45 = ZEXT3264(auVar39);
              auVar41 = vpunpckhwd_avx2(auVar10,auVar43);
              auVar40 = vpaddd_avx2(auVar40,auVar41);
              auVar42 = ZEXT3264(auVar40);
              auVar41 = vpunpckhwd_avx2(auVar11,auVar7);
              auVar44 = vpaddd_avx2(auVar44,auVar41);
              auVar47 = ZEXT3264(auVar44);
              auVar41 = vpunpckhwd_avx2(auVar12,auVar8);
              auVar38 = vpaddd_avx2(auVar38,auVar41);
              auVar46 = ZEXT3264(auVar38);
              lVar27 = lVar27 + 0x10;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          auVar43 = vpunpckldq_avx2(auVar39,auVar40);
          auVar7 = vpunpckldq_avx2(auVar44,auVar38);
          auVar41 = vpunpckhdq_avx2(auVar39,auVar40);
          auVar44 = vpunpckhdq_avx2(auVar44,auVar38);
          auVar39 = vpermd_avx2(auVar48._0_32_,auVar7);
          auVar40 = vpermd_avx2(auVar49._0_32_,auVar43);
          auVar39 = vpblendd_avx2(auVar40,auVar39,0xcc);
          auVar38 = vpermd_avx2(auVar50._0_32_,auVar7);
          auVar40 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
          auVar43 = vpermd_avx2(auVar40,auVar43);
          auVar38 = vpblendd_avx2(auVar43,auVar38,0xcc);
          auVar39 = vpaddd_avx2(auVar38,auVar39);
          auVar38 = vpermd_avx2(auVar48._0_32_,auVar44);
          auVar43 = vpermd_avx2(auVar49._0_32_,auVar41);
          auVar38 = vpblendd_avx2(auVar43,auVar38,0xcc);
          auVar44 = vpermd_avx2(auVar50._0_32_,auVar44);
          auVar40 = vpermd_avx2(auVar40,auVar41);
          auVar40 = vpblendd_avx2(auVar40,auVar44,0xcc);
          auVar40 = vpaddd_avx2(auVar38,auVar40);
          auVar39 = vpaddd_avx2(auVar39,auVar40);
          *pauVar28 = auVar39;
          pauVar28 = pauVar28 + 1;
          uVar17 = iVar36 + 2;
          uVar31 = (ulong)uVar17;
          uVar21 = (uint)(byte)((char)uVar21 + 1);
          uVar25 = (ulong)uVar17;
        } while (iVar36 + 3 < (int)uVar2);
      }
      else {
        uVar31 = uVar25 & 0xffffffff;
      }
      if ((int)uVar31 < (int)uVar2) {
        do {
          uVar21 = (uint)uVar31;
          if (iVar37 < 1) {
            auVar39 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          }
          else {
            pauVar18 = (undefined1 (*) [16])
                       (kernel->cstep * uVar19 * kernel->elemsize + (long)kernel->data);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            lVar24 = 0;
            auVar46 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)local_108.data +
                                       lVar24 * 8 +
                                       local_108.cstep * local_108.elemsize *
                                       (ulong)((uVar21 & 1) + (int)(uVar31 >> 2) +
                                              (uint)((uVar21 >> 1 & 1) != 0)));
              auVar1 = vpmovsxbw_avx(auVar1);
              auVar39 = vpmovsxbw_avx2(*pauVar18);
              auVar40 = vpmovsxbw_avx2(pauVar18[1]);
              auVar38._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
              auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
              auVar41 = vpmullw_avx2(auVar38,auVar39);
              auVar44 = vpmulhw_avx2(auVar38,auVar39);
              auVar43 = vpmullw_avx2(auVar38,auVar40);
              auVar38 = vpmulhw_avx2(auVar38,auVar40);
              auVar39 = vpunpcklwd_avx2(auVar41,auVar44);
              auVar39 = vpaddd_avx2(auVar46._0_32_,auVar39);
              auVar40 = vpunpcklwd_avx2(auVar43,auVar38);
              auVar40 = vpaddd_avx2(auVar45._0_32_,auVar40);
              auVar44 = vpunpckhwd_avx2(auVar41,auVar44);
              auVar39 = vpaddd_avx2(auVar39,auVar44);
              auVar46 = ZEXT3264(auVar39);
              auVar44 = vpunpckhwd_avx2(auVar43,auVar38);
              auVar40 = vpaddd_avx2(auVar40,auVar44);
              auVar45 = ZEXT3264(auVar40);
              pauVar18 = pauVar18 + 2;
              lVar24 = lVar24 + 1;
            } while (iVar37 != (int)lVar24);
          }
          auVar1 = vpunpckldq_avx(auVar39._0_16_,auVar39._16_16_);
          auVar5 = vpunpckldq_avx(auVar40._0_16_,auVar40._16_16_);
          auVar3 = vpunpckhdq_avx(auVar39._0_16_,auVar39._16_16_);
          auVar4 = vpunpckhdq_avx(auVar40._0_16_,auVar40._16_16_);
          auVar6 = vpunpcklqdq_avx(auVar1,auVar5);
          auVar1 = vpunpckhqdq_avx(auVar1,auVar5);
          auVar1 = vpaddd_avx(auVar6,auVar1);
          auVar5 = vpunpcklqdq_avx(auVar3,auVar4);
          auVar3 = vpunpckhqdq_avx(auVar3,auVar4);
          auVar3 = vpaddd_avx(auVar3,auVar5);
          auVar1 = vpaddd_avx(auVar1,auVar3);
          *(undefined1 (*) [16])*pauVar28 = auVar1;
          pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
          uVar31 = (ulong)(uVar21 + 1);
        } while (uVar21 + 1 != uVar2);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != local_c0);
  }
  piVar16 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}